

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_fff2c7::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
ArgumentParserWithOutputVariable
          (ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this)

{
  string_view name;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  memset(this,0,0x88);
  local_30._8_8_ = 0;
  local_30._M_unused._M_member_pointer = 0x30;
  local_18 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
             ::_M_manager;
  name._M_str = "OUTPUT_VARIABLE";
  name._M_len = 0xf;
  ArgumentParser::Base::Bind((Base *)this,name,(KeywordAction *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

ArgumentParserWithOutputVariable()
    : CMakePathArgumentParser<Result>()
  {
    this->Bind("OUTPUT_VARIABLE"_s, &Result::Output);
  }